

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

void __thiscall cmLoadedCommand::~cmLoadedCommand(cmLoadedCommand *this)

{
  char *__ptr;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmLoadedCommand_006ecf10;
  if ((this->info).Destructor != (CM_DESTRUCTOR_FUNCTION)0x0) {
    InstallSignalHandlers((this->info).Name,0);
    (*(this->info).Destructor)(&this->info);
    InstallSignalHandlers((this->info).Name,1);
  }
  __ptr = (this->info).Error;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_006eb410;
  pcVar1 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar2 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmLoadedCommand::~cmLoadedCommand()
{
  if (this->info.Destructor) {
    cmLoadedCommand::InstallSignalHandlers(info.Name);
    this->info.Destructor((void*)&this->info);
    cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  }
  if (this->info.Error) {
    free(this->info.Error);
  }
}